

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * google::protobuf::io::CodedInputStream::ReadLittleEndian64FromArray
                  (uint8 *buffer,uint64 *value)

{
  uint64 *value_local;
  uint8 *buffer_local;
  
  *value = *(uint64 *)buffer;
  return buffer + 8;
}

Assistant:

inline const uint8* CodedInputStream::ReadLittleEndian64FromArray(
    const uint8* buffer, uint64* value) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  memcpy(value, buffer, sizeof(*value));
  return buffer + sizeof(*value);
#else
  uint32 part0 = (static_cast<uint32>(buffer[0])) |
                 (static_cast<uint32>(buffer[1]) << 8) |
                 (static_cast<uint32>(buffer[2]) << 16) |
                 (static_cast<uint32>(buffer[3]) << 24);
  uint32 part1 = (static_cast<uint32>(buffer[4])) |
                 (static_cast<uint32>(buffer[5]) << 8) |
                 (static_cast<uint32>(buffer[6]) << 16) |
                 (static_cast<uint32>(buffer[7]) << 24);
  *value = static_cast<uint64>(part0) | (static_cast<uint64>(part1) << 32);
  return buffer + sizeof(*value);
#endif
}